

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerSupportVectorMachine.cpp
# Opt level: O2

bool __thiscall tfs::DnnLayerSupportVectorMachine::runForward(DnnLayerSupportVectorMachine *this)

{
  Matrix *dst;
  TMatrix<double> *this_00;
  bool bVar1;
  EVP_PKEY_CTX *in_RDX;
  
  dst = (this->super_DnnLayer).m_in_a;
  if ((((dst != (Matrix *)0x0) && (dst->m_data != (double *)0x0)) && (dst->m_data <= dst->m_end)) &&
     (((this_00 = (this->super_DnnLayer).m_out_a, this_00 != (TMatrix<double> *)0x0 &&
       (this_00->m_data != (double *)0x0)) && (this_00->m_data <= this_00->m_end)))) {
    TMatrix<double>::copy(this_00,(EVP_PKEY_CTX *)dst,in_RDX);
    return true;
  }
  bVar1 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerSupportVectorMachine.cpp"
                         ,"runForward",0x1c,"Not configured");
  return bVar1;
}

Assistant:

bool
    DnnLayerSupportVectorMachine::runForward(  void ) {
        // -----------------------------------------------------------------------------------
        // virtual: Forward propagate, used with forward()
        // -----------------------------------------------------------------------------------
        if( matrixBad( m_in_a ) || matrixBad( m_out_a )) {
            return log_error( "Not configured" );
        }
        m_out_a->copy( *m_in_a );   // Simple identity
        return true;
    }